

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatcher_manager.cc
# Opt level: O2

void __thiscall
iqxmlrpc::Method_dispatcher_manager::enable_introspection(Method_dispatcher_manager *this)

{
  Default_method_dispatcher *pDVar1;
  mapped_type pMVar2;
  mapped_type *ppMVar3;
  allocator<char> local_39;
  key_type local_38;
  
  pDVar1 = this->impl_->default_disp;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"system.listMethods",&local_39);
  pMVar2 = (mapped_type)operator_new(0x10);
  pMVar2->_vptr_Method_factory_base = (_func_int **)&PTR__Method_factory_base_0019c368;
  pMVar2[1]._vptr_Method_factory_base = (_func_int **)this;
  ppMVar3 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iqxmlrpc::Method_factory_base_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iqxmlrpc::Method_factory_base_*>_>_>
            ::operator[](&pDVar1->fs,&local_38);
  *ppMVar3 = pMVar2;
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void Method_dispatcher_manager::enable_introspection()
{
  impl_->default_disp->register_method("system.listMethods",
    new System_method_factory<builtins::List_methods>(this));
}